

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

ByteData *
cfd::core::GetPsbtOutput
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt_output *output,
          bool *is_find)

{
  char cVar1;
  wally_map_item *pwVar2;
  ByteData *extraout_RAX;
  ByteData *extraout_RAX_00;
  ByteData *extraout_RAX_01;
  ByteData *extraout_RAX_02;
  ByteData *extraout_RAX_03;
  ByteData *extraout_RAX_04;
  ByteData *extraout_RAX_05;
  ByteData *pBVar3;
  ByteData *extraout_RAX_06;
  CfdException *pCVar4;
  long *plVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_t sVar7;
  long lVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey;
  Pubkey pk;
  size_t index;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pk_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  undefined1 local_e0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  size_t local_80;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  ByteData local_48;
  
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  ByteData::GetBytes(&local_60,key_data);
  lVar8 = (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  cVar1 = *(char *)(wally_map_item **)
                   local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
  if (cVar1 == '\x02') {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,lVar8 - 1,
               (allocator_type *)local_e0);
    if (local_c0._M_string_length - (long)local_c0._M_dataplus._M_p != 0) {
      memcpy(local_c0._M_dataplus._M_p,
             (void *)((long)(wally_map_item **)
                            local_60.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1),
             local_c0._M_string_length - (long)local_c0._M_dataplus._M_p);
    }
    ByteData::ByteData(&local_48,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0)
    ;
    Pubkey::Pubkey((Pubkey *)&local_a0,&local_48);
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    Pubkey::GetData((ByteData *)local_e0,(Pubkey *)&local_a0);
    ByteData::GetBytes(&local_78,(ByteData *)local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_e0._0_8_);
    }
    local_80 = 0;
    local_e0._0_8_ = &local_d0;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"output bip32 pubkey","");
    FindPsbtMap((core *)&output->keypaths,
                (wally_map *)
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start,
                (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish,(string *)local_e0,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._0_8_ != &local_d0) {
      operator_delete((void *)local_e0._0_8_);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar2 = (output->keypaths).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar2[local_80].value,
                       (uint32_t)pwVar2[local_80].value_len);
    pBVar3 = extraout_RAX_00;
    if ((wally_map *)
        local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (wally_map *)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      pBVar3 = extraout_RAX_01;
    }
    if (local_a0._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_a0._M_dataplus._M_p);
      pBVar3 = extraout_RAX_02;
    }
    if (local_c0._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_c0._M_dataplus._M_p);
      pBVar3 = extraout_RAX_03;
    }
    goto LAB_001cc6f7;
  }
  if (cVar1 == '\x01') {
    if (lVar8 != 1) {
      local_e0._0_8_ = "cfdcore_psbt.cpp";
      local_e0._8_4_ = 0x5e4;
      local_d0._M_allocated_capacity = 0x21dc3b;
      logger::log<>((CfdSourceLocation *)local_e0,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_e0._0_8_ = &local_d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_e0);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar7 = output->witness_script_len;
    if (sVar7 == 0) {
      if (is_find == (bool *)0x0) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ByteData::GetHex_abi_cxx11_(&local_a0,key_data);
        ::std::operator+(&local_c0,"psbt target key ",&local_a0);
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_c0);
        local_e0._0_8_ = *plVar5;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._0_8_ == paVar6) {
          local_d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_d0._8_8_ = plVar5[3];
          local_e0._0_8_ = &local_d0;
        }
        else {
          local_d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_e0._8_8_ = plVar5[1];
        *plVar5 = (long)paVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_e0);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
LAB_001cc6ef:
      ByteData::ByteData(__return_storage_ptr__);
      pBVar3 = extraout_RAX_05;
      goto LAB_001cc6f7;
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    output = (wally_psbt_output *)&output->witness_script;
  }
  else {
    if (cVar1 != '\0') {
      local_c0._M_dataplus._M_p = (pointer)0x0;
      local_e0._0_8_ = &local_d0;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e0,"output unknowns","");
      FindPsbtMap((core *)&output->unknowns,
                  (wally_map *)
                  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                  local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish,(string *)local_e0,(size_t *)&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._0_8_ != &local_d0) {
        operator_delete((void *)local_e0._0_8_);
      }
      if (is_find != (bool *)0x0) {
        *is_find = true;
      }
      pwVar2 = (output->unknowns).items;
      ByteData::ByteData(__return_storage_ptr__,pwVar2[(long)local_c0._M_dataplus._M_p].value,
                         (uint32_t)pwVar2[(long)local_c0._M_dataplus._M_p].value_len);
      pBVar3 = extraout_RAX_04;
      goto LAB_001cc6f7;
    }
    if (lVar8 != 1) {
      local_e0._0_8_ = "cfdcore_psbt.cpp";
      local_e0._8_4_ = 0x5d4;
      local_d0._M_allocated_capacity = 0x21dc3b;
      logger::log<>((CfdSourceLocation *)local_e0,kCfdLogLevelWarning,"psbt invalid key format.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_e0._0_8_ = &local_d0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e0,"psbt invalid key format error.","");
      CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_e0);
      __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
    }
    sVar7 = output->redeem_script_len;
    if (sVar7 == 0) {
      if (is_find == (bool *)0x0) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        ByteData::GetHex_abi_cxx11_(&local_a0,key_data);
        ::std::operator+(&local_c0,"psbt target key ",&local_a0);
        plVar5 = (long *)::std::__cxx11::string::append((char *)&local_c0);
        local_e0._0_8_ = *plVar5;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar5 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._0_8_ == paVar6) {
          local_d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_d0._8_8_ = plVar5[3];
          local_e0._0_8_ = &local_d0;
        }
        else {
          local_d0._M_allocated_capacity = paVar6->_M_allocated_capacity;
        }
        local_e0._8_8_ = plVar5[1];
        *plVar5 = (long)paVar6;
        plVar5[1] = 0;
        *(undefined1 *)(plVar5 + 2) = 0;
        CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_e0);
        __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
      }
      goto LAB_001cc6ef;
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
  }
  ByteData::ByteData(__return_storage_ptr__,output->redeem_script,(uint32_t)sVar7);
  pBVar3 = extraout_RAX;
LAB_001cc6f7:
  if ((wally_map *)
      local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (wally_map *)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    pBVar3 = extraout_RAX_06;
  }
  return pBVar3;
}

Assistant:

static ByteData GetPsbtOutput(
    const ByteData &key_data, struct wally_psbt_output *output,
    bool *is_find) {
  if (is_find != nullptr) *is_find = false;
  const auto key = key_data.GetBytes();
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtOutputRedeemScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->redeem_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->redeem_script,
          static_cast<uint32_t>(output->redeem_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputWitnessScript) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (output->witness_script_len != 0) {
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->witness_script,
          static_cast<uint32_t>(output->witness_script_len));
    } else if (is_find == nullptr) {
      throw CfdException(
          kCfdIllegalArgumentError,
          "psbt target key " + key_data.GetHex() + " not found error.");
    }
  } else if (key[0] == Psbt::kPsbtOutputBip32Derivation) {
    std::vector<uint8_t> pubkey(key.size() - 1);
    if (pubkey.size() != 0) {
      memcpy(pubkey.data(), &key.data()[1], pubkey.size());
    }
    Pubkey pk(pubkey);
    auto pk_bytes = pk.GetData().GetBytes();
    size_t index = 0;
    try {
      FindPsbtMap(&output->keypaths, pk_bytes, "output bip32 pubkey", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->keypaths.items[index].value,
          static_cast<uint32_t>(output->keypaths.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&output->unknowns, key, "output unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          output->unknowns.items[index].value,
          static_cast<uint32_t>(output->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}